

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.h
# Opt level: O0

void MuHash3072::SerializationOps<DataStream,MuHash3072,ActionUnserialize>(void)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ActionUnserialize::SerReadWriteMany<DataStream,Num3072&>
            (in_stack_ffffffffffffffd8,(Num3072 *)0x93d97f);
  ActionUnserialize::SerReadWriteMany<DataStream,Num3072&>
            (in_stack_ffffffffffffffd8,(Num3072 *)0x93d995);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(MuHash3072, obj)
    {
        READWRITE(obj.m_numerator);
        READWRITE(obj.m_denominator);
    }